

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

Function * __thiscall Functions::returnFunction(Functions *this,Function *function)

{
  pointer ppFVar1;
  pointer ppFVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  string findFID;
  string stackFID;
  vector<Function_*,_std::allocator<Function_*>_> local_90;
  vector<Function_*,_std::allocator<Function_*>_> local_78;
  long *local_58;
  pointer local_50;
  long local_48 [2];
  Function *local_38;
  
  uVar4 = 0;
  do {
    std::vector<Function_*,_std::allocator<Function_*>_>::vector(&local_78,&this->_functionStack);
    ppFVar2 = local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppFVar1 = local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((ulong)((long)ppFVar2 - (long)ppFVar1 >> 3) <= uVar4) {
      return local_38;
    }
    (*(function->super_Statement)._vptr_Statement[3])(&local_78,function);
    std::vector<Function_*,_std::allocator<Function_*>_>::vector(&local_90,&this->_functionStack);
    (*(local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
       super__Vector_impl_data._M_start[uVar4]->super_Statement)._vptr_Statement[3])(&local_58);
    if (local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish == local_50) {
      if (local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
          super__Vector_impl_data._M_finish == (pointer)0x0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp(local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                     super__Vector_impl_data._M_start,local_58,
                     (size_t)local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
        bVar5 = iVar3 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      std::vector<Function_*,_std::allocator<Function_*>_>::vector(&local_90,&this->_functionStack);
      local_38 = local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4];
      if (local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    if (local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    uVar4 = uVar4 + 1;
  } while (!bVar5);
  return local_38;
}

Assistant:

Function *Functions::returnFunction(Function *function) {
    for(int i = 0; i < getFunctionStack().size();i++){
        std::string findFID =function->id();
        std::string stackFID = getFunctionStack()[i]->id();
        if(findFID == stackFID ) {
            return getFunctionStack()[i];
        }
    }
}